

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O2

String * asl::Url::encode(String *__return_storage_ptr__,String *q0_,bool component)

{
  bool bVar1;
  int iVar2;
  anon_union_16_2_78e7fdac_for_String_2 *paVar3;
  char *chars;
  undefined7 in_register_00000011;
  int i;
  long lVar4;
  byte c;
  
  lVar4 = 0;
  String::String(__return_storage_ptr__,q0_->_len,0);
  chars = "-_.!~*\'();/?:@&=+$,#";
  if ((int)CONCAT71(in_register_00000011,component) != 0) {
    chars = "-_.!~*\'()";
  }
  for (; lVar4 < q0_->_len; lVar4 = lVar4 + 1) {
    paVar3 = &q0_->field_2;
    if (q0_->_size != 0) {
      paVar3 = (anon_union_16_2_78e7fdac_for_String_2 *)(q0_->field_2)._str;
    }
    c = paVar3->_space[lVar4];
    iVar2 = isalnum((uint)c);
    if ((iVar2 == 0) && (bVar1 = isanyof(c,chars), !bVar1)) {
      String::operator+=(__return_storage_ptr__,'%');
      String::operator+=(__return_storage_ptr__,"0123456789ABCDEF"[c >> 4]);
      c = "0123456789ABCDEF"[c & 0xf];
    }
    String::operator+=(__return_storage_ptr__,c);
  }
  return __return_storage_ptr__;
}

Assistant:

String Url::encode(const String& q0_, bool component)
{
#ifdef ASL_ANSI
	String q0 = localToUtf8(q0_);
#else
	const String& q0 = q0_;
#endif

	String q(q0.length(), 0);
	for (int i = 0; i < q0.length(); i++)
	{
		byte c = *(byte*)&q0[i];
		if (!isalnum(c) && !isanyof(c, component ? "-_.!~*'()" : "-_.!~*'();/?:@&=+$,#"))
			q << '%' << hexNibble(c >> 4) << hexNibble(c & 0x0f);
		else
			q << (char)c;
	}
	return q;
}